

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O1

void run_container_remove_range(run_container_t *run,uint32_t min,uint32_t max)

{
  ushort uVar1;
  rle16_t *prVar2;
  bool bVar3;
  long lVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint unaff_R12D;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ushort uVar14;
  
  uVar5 = (ushort)min;
  prVar2 = run->runs;
  iVar13 = run->n_runs;
  iVar11 = iVar13 + -1;
  uVar7 = 0;
  iVar8 = iVar11;
  do {
    if (iVar8 < (int)uVar7) {
      uVar7 = ~uVar7;
      uVar6 = uVar7;
      break;
    }
    uVar6 = uVar7 + iVar8 >> 1;
    if ((ushort)(prVar2[uVar6].length + prVar2[uVar6].value) < uVar5) {
      uVar7 = uVar6 + 1;
      bVar3 = true;
      uVar6 = unaff_R12D;
    }
    else if (uVar5 < prVar2[uVar6].value) {
      iVar8 = uVar6 - 1;
      bVar3 = true;
      uVar6 = unaff_R12D;
    }
    else {
      bVar3 = false;
    }
    unaff_R12D = uVar6;
  } while (bVar3);
  uVar10 = 0;
  do {
    uVar14 = (ushort)max;
    if (iVar11 < (int)uVar10) {
      uVar7 = ~uVar10;
      break;
    }
    uVar9 = uVar10 + iVar11 >> 1;
    if ((ushort)(prVar2[uVar9].length + prVar2[uVar9].value) < uVar14) {
      uVar10 = uVar9 + 1;
      bVar3 = true;
    }
    else if (uVar14 < prVar2[uVar9].value) {
      iVar11 = uVar9 - 1;
      bVar3 = true;
    }
    else {
      bVar3 = false;
      uVar7 = uVar9;
    }
  } while (bVar3);
  if ((int)uVar6 < 0) {
    uVar6 = ~uVar6;
  }
  else {
    uVar1 = prVar2[uVar6].value;
    if (uVar1 < min) {
      if (max < (uint)prVar2[uVar6].length + (uint)uVar1) {
        uVar12 = (long)(int)uVar6 + 1;
        if (run->capacity <= iVar13) {
          run_container_grow(run,iVar13 + 1,true);
        }
        memmove(run->runs + (uVar12 & 0xffff) + 1,run->runs + (uVar12 & 0xffff),
                ((long)run->n_runs - (uVar12 & 0xffff)) * 4);
        run->n_runs = run->n_runs + 1;
        prVar2 = run->runs;
        prVar2[uVar12 & 0xffffffff].value = uVar14 + 1;
        uVar1 = prVar2[uVar6].value;
        prVar2[uVar12 & 0xffffffff].length = ~uVar14 + uVar1 + prVar2[uVar6].length;
        prVar2[uVar6].length = ~uVar1 + uVar5;
        return;
      }
      if (uVar1 < min) {
        prVar2[uVar6].length = ~uVar1 + uVar5;
        uVar6 = uVar6 + 1;
      }
    }
  }
  if ((int)uVar7 < 0) {
    uVar7 = -uVar7 - 2;
  }
  else {
    uVar5 = prVar2[uVar7].length + prVar2[uVar7].value;
    if (max < uVar5) {
      prVar2[uVar7].value = uVar14 + 1;
      prVar2[uVar7].length = uVar5 - (uVar14 + 1);
      uVar7 = uVar7 - 1;
    }
  }
  if ((int)uVar6 <= (int)uVar7) {
    iVar13 = iVar13 + ~uVar7;
    iVar11 = uVar6 + ~uVar7;
    if ((0 < iVar11) && (run->capacity < iVar11 + iVar13)) {
      run_container_grow(run,iVar11 + iVar13,true);
    }
    lVar4 = (long)run->n_runs - (long)iVar13;
    memmove(run->runs + ((int)lVar4 + iVar11),run->runs + lVar4,(long)iVar13 << 2);
    run->n_runs = run->n_runs + iVar11;
  }
  return;
}

Assistant:

static inline void run_container_remove_range(run_container_t *run,
                                              uint32_t min, uint32_t max) {
    int32_t first = rle16_find_run(run->runs, run->n_runs, (uint16_t)min);
    int32_t last = rle16_find_run(run->runs, run->n_runs, (uint16_t)max);

    if (first >= 0 && min > run->runs[first].value &&
        max < ((uint32_t)run->runs[first].value +
               (uint32_t)run->runs[first].length)) {
        // split this run into two adjacent runs

        // right subinterval
        makeRoomAtIndex(run, (uint16_t)(first + 1));
        run->runs[first + 1].value = (uint16_t)(max + 1);
        run->runs[first + 1].length =
            (uint16_t)((run->runs[first].value + run->runs[first].length) -
                       (max + 1));

        // left subinterval
        run->runs[first].length =
            (uint16_t)((min - 1) - run->runs[first].value);

        return;
    }

    // update left-most partial run
    if (first >= 0) {
        if (min > run->runs[first].value) {
            run->runs[first].length =
                (uint16_t)((min - 1) - run->runs[first].value);
            first++;
        }
    } else {
        first = -first - 1;
    }

    // update right-most run
    if (last >= 0) {
        uint16_t run_max = run->runs[last].value + run->runs[last].length;
        if (run_max > max) {
            run->runs[last].value = (uint16_t)(max + 1);
            run->runs[last].length = (uint16_t)(run_max - (max + 1));
            last--;
        }
    } else {
        last = (-last - 1) - 1;
    }

    // remove intermediate runs
    if (first <= last) {
        run_container_shift_tail(run, run->n_runs - (last + 1),
                                 -(last - first + 1));
    }
}